

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace.cc
# Opt level: O1

int absl::lts_20250127::GetStackTrace(void **result,int max_depth,int skip_count)

{
  int iVar1;
  code *pcVar2;
  
  pcVar2 = UnwindImpl<false,false>;
  if (_ZN4absl12lts_2025012712_GLOBAL__N_16customE_0 != (code *)0x0) {
    pcVar2 = _ZN4absl12lts_2025012712_GLOBAL__N_16customE_0;
  }
  iVar1 = (*pcVar2)(result,0,max_depth,skip_count + 1,0,0);
  return iVar1;
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE ABSL_ATTRIBUTE_NO_TAIL_CALL int GetStackTrace(
    void** result, int max_depth, int skip_count) {
  return Unwind<false, false>(result, nullptr, max_depth, skip_count, nullptr,
                              nullptr);
}